

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoStore<unsigned_long,unsigned_char>(Thread *this,Instr instr,Ptr *out_trap)

{
  ulong uVar1;
  pointer puVar2;
  Store *store;
  RunResult RVar3;
  Value VVar4;
  Value VVar5;
  Ptr memory;
  Ptr local_68;
  string local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&memory,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar4 = Pop(this);
  VVar5 = Pop(this);
  uVar1 = (ulong)VVar5.i32_ + (ulong)instr.field_2.imm_u32x2.snd;
  puVar2 = ((memory.obj_)->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar1 < (ulong)((long)((memory.obj_)->data_).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    puVar2[(ulong)instr.field_2.imm_u32x2.snd + (ulong)VVar5.i32_] = VVar4._0_1_;
    RVar3 = Ok;
  }
  else {
    store = this->store_;
    StringPrintf_abi_cxx11_
              (&local_48,"out of bounds memory access: access at %lu+%zd >= max value %u",uVar1,1);
    Trap::New(&local_68,store,&local_48,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar3 = Trap;
  }
  RefPtr<wabt::interp::Memory>::reset(&memory);
  return RVar3;
}

Assistant:

RunResult Thread::DoStore(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V val = static_cast<V>(Pop<T>());
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->Store(offset, instr.imm_u32x2.snd, val)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %u",
                       u64{offset} + instr.imm_u32x2.snd, sizeof(V),
                       memory->ByteSize()));
  return RunResult::Ok;
}